

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexer.cxx
# Opt level: O3

void cmCTestResourceGroups_yy_switch_to_buffer(YY_BUFFER_STATE new_buffer,yyscan_t yyscanner)

{
  YY_BUFFER_STATE pyVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  yyguts_t *yyg;
  
  cmCTestResourceGroups_yyensure_buffer_stack(yyscanner);
  lVar4 = *(long *)((long)yyscanner + 0x28);
  if (lVar4 != 0) {
    lVar3 = *(long *)((long)yyscanner + 0x18);
    pyVar1 = *(YY_BUFFER_STATE *)(lVar4 + lVar3 * 8);
    if (pyVar1 != new_buffer) {
      if (pyVar1 != (YY_BUFFER_STATE)0x0) {
        **(undefined1 **)((long)yyscanner + 0x40) = *(undefined1 *)((long)yyscanner + 0x30);
        lVar3 = *(long *)((long)yyscanner + 0x18);
        lVar4 = *(long *)((long)yyscanner + 0x28);
        *(undefined8 *)(*(long *)(lVar4 + lVar3 * 8) + 0x10) =
             *(undefined8 *)((long)yyscanner + 0x40);
        *(undefined4 *)(*(long *)(lVar4 + lVar3 * 8) + 0x1c) =
             *(undefined4 *)((long)yyscanner + 0x34);
      }
      *(YY_BUFFER_STATE *)(lVar4 + lVar3 * 8) = new_buffer;
      lVar4 = *(long *)(*(long *)((long)yyscanner + 0x28) + lVar3 * 8);
      *(undefined4 *)((long)yyscanner + 0x34) = *(undefined4 *)(lVar4 + 0x1c);
      puVar2 = *(undefined1 **)(lVar4 + 0x10);
      *(undefined1 **)((long)yyscanner + 0x40) = puVar2;
      *(undefined1 **)((long)yyscanner + 0x80) = puVar2;
      *(undefined8 *)((long)yyscanner + 8) =
           **(undefined8 **)(*(long *)((long)yyscanner + 0x28) + lVar3 * 8);
      *(undefined1 *)((long)yyscanner + 0x30) = *puVar2;
      *(undefined4 *)((long)yyscanner + 0x50) = 1;
    }
  }
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack (yyscanner);
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state( yyscanner );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	yyg->yy_did_buffer_switch_on_eof = 1;
}